

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ContainerPrinter::
     PrintValue<std::__cxx11::list<bool,std::allocator<bool>>,void>
               (list<bool,_std::allocator<bool>_> *container,ostream *os)

{
  char8_t *pcVar1;
  long lVar2;
  _List_node_base *p_Var3;
  char local_35;
  char local_34;
  char local_33;
  char local_32;
  char local_31;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_33,1);
  p_Var3 = (container->super__List_base<bool,_std::allocator<bool>_>)._M_impl._M_node.
           super__List_node_base._M_next;
  if (p_Var3 != (_List_node_base *)container) {
    lVar2 = 0;
    do {
      if ((lVar2 != 0) &&
         (std::__ostream_insert<char,std::char_traits<char>>(os,&local_35,1), lVar2 == 0x20)) {
        std::__ostream_insert<char,std::char_traits<char>>(os," ...",4);
        goto LAB_001cee5f;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_34,1);
      pcVar1 = "some_false";
      if ((ulong)*(byte *)&p_Var3[1]._M_next != 0) {
        pcVar1 = "some_true";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (os,pcVar1 + 5,(ulong)*(byte *)&p_Var3[1]._M_next ^ 5);
      lVar2 = lVar2 + 1;
      p_Var3 = (((_List_base<bool,_std::allocator<bool>_> *)&p_Var3->_M_next)->_M_impl)._M_node.
               super__List_node_base._M_next;
    } while (p_Var3 != (_List_node_base *)container);
    if (lVar2 != 0) {
LAB_001cee5f:
      std::__ostream_insert<char,std::char_traits<char>>(os,&local_32,1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,&local_31,1);
  return;
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }